

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::ElementsPeginTxIn::ElementsPeginTxIn(ElementsPeginTxIn *this)

{
  allocator local_11;
  ElementsPeginTxIn *local_10;
  ElementsPeginTxIn *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ElementsPeginTxIn>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ElementsPeginTxIn>);
  (this->super_JsonClassBase<cfd::js::api::json::ElementsPeginTxIn>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ElementsPeginTxIn_01b4ba48;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  this->is_pegin_ = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->vout_ = 0;
  this->sequence_ = 0xffffffff;
  ElementsAddPeginWitness::ElementsAddPeginWitness(&this->peginwitness_);
  this->is_remove_mainchain_tx_witness_ = false;
  CollectFieldName();
  return;
}

Assistant:

ElementsPeginTxIn() {
    CollectFieldName();
  }